

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O3

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  quint64 qVar1;
  uchar *puVar2;
  ulong uVar3;
  QArrayData *pQVar4;
  bool bVar5;
  quint64 qVar6;
  long lVar7;
  ssize_t sVar8;
  undefined7 extraout_var;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QByteArray *outputBuffer;
  ulong uVar9;
  long in_FS_OFFSET;
  quint32 len;
  uchar compressed;
  uint local_50;
  uchar local_49;
  BitIStream local_48;
  long local_28;
  
  outputBuffer = (QByteArray *)CONCAT44(in_register_00000034,__fd);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = this->offset;
  local_49 = '\0';
  qVar6 = peekBits<unsigned_char>(this,qVar1,1,&local_49);
  if (((qVar6 == 1) && (lVar7 = ((long)this->last - (long)this->first) * 8, lVar7 != 0)) &&
     (this->offset <= lVar7 - 1U)) {
    __nbytes_00 = this->offset + 1;
    this->offset = __nbytes_00;
    this->streamError = NoError;
    local_50 = 0;
    sVar8 = read(this,(int)&local_50,__buf_00,__nbytes_00);
    if ((char)sVar8 != '\0') {
      uVar9 = (ulong)local_50;
      puVar2 = this->first;
      uVar3 = this->offset;
      if (uVar9 <= ((long)this->last - (long)puVar2) * 8 - uVar3 >> 3) {
        if (local_49 == '\0') {
          QByteArray::QByteArray((QByteArray *)&local_48,(char *)(puVar2 + (uVar3 >> 3)),uVar9);
          pQVar4 = &((outputBuffer->d).d)->super_QArrayData;
          puVar2 = (uchar *)(outputBuffer->d).ptr;
          (outputBuffer->d).d = (Data *)local_48.first;
          (outputBuffer->d).ptr = (char *)local_48.last;
          qVar1 = (outputBuffer->d).size;
          (outputBuffer->d).size = local_48.offset;
          local_48.first = (uchar *)pQVar4;
          local_48.last = puVar2;
          local_48.offset = qVar1;
          if (pQVar4 != (QArrayData *)0x0) {
            LOCK();
            (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar4,1,0x10);
            }
          }
          lVar7 = (ulong)local_50 * 8;
          this->offset = this->offset + lVar7;
        }
        else {
          local_48.first = puVar2 + (uVar3 >> 3);
          local_48.last =
               (uchar *)((long)&(((QArrayData *)local_48.first)->ref_)._q_value.
                                super___atomic_base<int>._M_i + uVar9);
          local_48.offset = 0;
          local_48.streamError = NoError;
          local_48._28_4_ = 0xaaaaaaaa;
          bVar5 = huffman_decode_string(&local_48,outputBuffer);
          lVar7 = CONCAT71(extraout_var,bVar5);
          if (!bVar5) {
            this->streamError = CompressionError;
            goto LAB_001d944a;
          }
          this->offset = this->offset + uVar9 * 8;
        }
        sVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
        goto LAB_001d9313;
      }
      this->streamError = NotEnoughData;
    }
LAB_001d944a:
    this->offset = qVar1;
  }
  else {
    this->streamError = NotEnoughData;
  }
  sVar8 = 0;
LAB_001d9313:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return sVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool BitIStream::read(QByteArray *dstPtr)
{
    Q_ASSERT(dstPtr);
    QByteArray &dst = *dstPtr;
    //5.2 String Literal Representation
    //
    // Header field names and header field values can be represented as string literals.
    // A string literal is compressed as a sequence of octets, either by directly encoding
    // the string literal's octets or by using a Huffman code.

    // We update the offset _only_ if the read was successful.

    const quint64 oldOffset = offset;
    uchar compressed = 0;
    if (peekBits(offset, 1, &compressed) != 1 || !skipBits(1)) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    quint32 len = 0;
    if (read(&len)) {
        Q_ASSERT(!(offset % 8));
        if (len <= (bitLength() - offset) / 8) { // We have enough data to read a string ...
            if (!compressed) {
                // Now good news, integer always ends on a byte boundary.
                // We can read 'len' bytes without any bit magic.
                const char *src = reinterpret_cast<const char *>(first + offset / 8);
                dst = QByteArray(src, len);
                offset += quint64(len) * 8;
                return true;
            }

            BitIStream slice(first + offset / 8, first + offset / 8 + len);
            if (huffman_decode_string(slice, &dst)) {
                offset += quint64(len) * 8;
                return true;
            }

            setError(Error::CompressionError);
        } else {
            setError(Error::NotEnoughData);
        }
    } // else the exact reason was set by read(quint32).

    offset = oldOffset;
    return false;
}